

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeMoveto(BtCursor *pCur,void *pKey,i64 nKey,int bias,int *pRes)

{
  int iVar1;
  sqlite3 *db;
  UnpackedRecord *in_RSI;
  void *in_RDI;
  KeyInfo *unaff_retaddr;
  UnpackedRecord *pIdxKey;
  int rc;
  undefined4 in_stack_00000020;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_fffffffffffffffc;
  
  if (in_RSI == (UnpackedRecord *)0x0) {
    db = (sqlite3 *)0x0;
  }
  else {
    db = (sqlite3 *)
         sqlite3VdbeAllocUnpackedRecord
                   ((KeyInfo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (db == (sqlite3 *)0x0) {
      return 7;
    }
    sqlite3VdbeRecordUnpack(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI,in_RSI);
    if (*(u16 *)&db->pDfltColl == 0) {
      iVar1 = sqlite3CorruptError(0);
      goto LAB_0016e97b;
    }
  }
  iVar1 = sqlite3BtreeMovetoUnpacked
                    ((BtCursor *)nKey,(UnpackedRecord *)CONCAT44(bias,in_stack_00000020),(i64)pRes,
                     rc,(int *)pIdxKey);
LAB_0016e97b:
  if (db != (sqlite3 *)0x0) {
    sqlite3DbFree(db,in_stack_ffffffffffffffb8);
  }
  return iVar1;
}

Assistant:

static int btreeMoveto(
  BtCursor *pCur,     /* Cursor open on the btree to be searched */
  const void *pKey,   /* Packed key if the btree is an index */
  i64 nKey,           /* Integer key for tables.  Size of pKey for indices */
  int bias,           /* Bias search to the high end */
  int *pRes           /* Write search results here */
){
  int rc;                    /* Status code */
  UnpackedRecord *pIdxKey;   /* Unpacked index key */

  if( pKey ){
    assert( nKey==(i64)(int)nKey );
    pIdxKey = sqlite3VdbeAllocUnpackedRecord(pCur->pKeyInfo);
    if( pIdxKey==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3VdbeRecordUnpack(pCur->pKeyInfo, (int)nKey, pKey, pIdxKey);
    if( pIdxKey->nField==0 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto moveto_done;
    }
  }else{
    pIdxKey = 0;
  }
  rc = sqlite3BtreeMovetoUnpacked(pCur, pIdxKey, nKey, bias, pRes);
moveto_done:
  if( pIdxKey ){
    sqlite3DbFree(pCur->pKeyInfo->db, pIdxKey);
  }
  return rc;
}